

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertySingleValue::IfcPropertySingleValue
          (IfcPropertySingleValue *this)

{
  IfcPropertySingleValue *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xa8,"IfcPropertySingleValue");
  IfcSimpleProperty::IfcSimpleProperty
            ((IfcSimpleProperty *)this,&PTR_construction_vtable_24__00f9dad0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>,
             &PTR_construction_vtable_24__00f9db18);
  *(undefined8 *)this = 0xf9da40;
  *(undefined8 *)&this->field_0xa8 = 0xf9dab8;
  *(undefined8 *)&this->field_0x58 = 0xf9da68;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>).
  _vptr_ObjectHelper = (_func_int **)0xf9da90;
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe
            ((Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>).
              field_0x10);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->Unit);
  return;
}

Assistant:

IfcPropertySingleValue() : Object("IfcPropertySingleValue") {}